

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaClp.c
# Opt level: O3

Vec_Ptr_t * Gia_ManCollapse(Gia_Man_t *p,DdManager *dd,int nBddLimit,int fVerbose)

{
  uint uVar1;
  Gia_Obj_t *pGVar2;
  ulong uVar3;
  int iVar4;
  uint uVar5;
  Vec_Ptr_t *vFuncs;
  void **__s;
  DdNode *pDVar6;
  ulong uVar7;
  uint uVar8;
  Vec_Int_t *pVVar9;
  ulong uVar10;
  int iVar11;
  long lVar12;
  uint uVar13;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  
  Gia_ManCreateRefs(p);
  uVar1 = p->nObjs;
  uVar16 = (ulong)uVar1;
  vFuncs = (Vec_Ptr_t *)malloc(0x10);
  uVar5 = 8;
  if (6 < uVar1 - 1) {
    uVar5 = uVar1;
  }
  vFuncs->nCap = uVar5;
  if (uVar5 == 0) {
    __s = (void **)0x0;
  }
  else {
    __s = (void **)malloc((long)(int)uVar5 << 3);
  }
  vFuncs->pArray = __s;
  vFuncs->nSize = uVar1;
  memset(__s,0,(long)(int)uVar1 << 3);
  if (0 < *p->pRefs) {
    pDVar6 = Cudd_ReadLogicZero(dd);
    if ((int)uVar1 < 1) {
LAB_00663d46:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                    ,0x1a6,"void Vec_PtrWriteEntry(Vec_Ptr_t *, int, void *)");
    }
    *__s = pDVar6;
    pDVar6 = Cudd_ReadLogicZero(dd);
    Cudd_Ref(pDVar6);
  }
  pVVar9 = p->vCis;
  if (0 < pVVar9->nSize) {
    lVar15 = 0;
    do {
      iVar11 = pVVar9->pArray[lVar15];
      lVar12 = (long)iVar11;
      if ((lVar12 < 0) || (iVar4 = p->nObjs, iVar4 <= iVar11)) goto LAB_00663d27;
      if (iVar11 == 0) goto LAB_00663a9d;
      if (0 < p->pRefs[lVar12]) {
        pDVar6 = Cudd_bddIthVar(dd,(int)lVar15);
        if ((int)uVar1 <= iVar11) goto LAB_00663d46;
        __s[lVar12] = pDVar6;
        pDVar6 = Cudd_bddIthVar(dd,(int)lVar15);
        Cudd_Ref(pDVar6);
        pVVar9 = p->vCis;
      }
      lVar15 = lVar15 + 1;
    } while (lVar15 < pVVar9->nSize);
  }
  iVar4 = p->nObjs;
  if (0 < iVar4) {
LAB_00663a9d:
    lVar15 = 0;
    uVar14 = 0;
    do {
      pGVar2 = p->pObjs;
      if (pGVar2 == (Gia_Obj_t *)0x0) break;
      uVar3 = *(ulong *)(&pGVar2->field_0x0 + lVar15);
      uVar5 = (uint)uVar3;
      if ((~uVar5 & 0x1fffffff) != 0 && -1 < (int)uVar5) {
        uVar7 = -(uVar5 & 0x1fffffff) + uVar14;
        iVar11 = (int)uVar7;
        if ((iVar11 < 0) || ((int)uVar1 <= iVar11)) goto LAB_00663d65;
        uVar5 = (uint)(uVar3 >> 0x20);
        uVar10 = -(uVar5 & 0x1fffffff) + uVar14;
        uVar8 = (uint)uVar10;
        if (((int)uVar8 < 0) || (uVar1 <= uVar8)) goto LAB_00663d65;
        pDVar6 = Cudd_bddAndLimit(dd,(DdNode *)
                                     ((ulong)((uint)(uVar3 >> 0x1d) & 1) ^
                                     (ulong)__s[uVar7 & 0xffffffff]),
                                  (DdNode *)
                                  ((ulong)(uVar5 >> 0x1d & 1) ^ (ulong)__s[uVar10 & 0xffffffff]),
                                  nBddLimit);
        if (pDVar6 == (DdNode *)0x0) {
          Gia_ManCollapseDeref(dd,vFuncs);
          return (Vec_Ptr_t *)0x0;
        }
        Cudd_Ref(pDVar6);
        if (uVar16 <= uVar14) goto LAB_00663d46;
        __s[uVar14] = pDVar6;
        Gia_ObjCollapseDeref
                  (p,dd,vFuncs,(int)uVar14 - (*(uint *)(&pGVar2->field_0x0 + lVar15) & 0x1fffffff));
        Gia_ObjCollapseDeref
                  (p,dd,vFuncs,(int)uVar14 - (*(uint *)(&pGVar2->field_0x4 + lVar15) & 0x1fffffff));
        iVar4 = p->nObjs;
      }
      uVar14 = uVar14 + 1;
      lVar15 = lVar15 + 0xc;
    } while ((long)uVar14 < (long)iVar4);
  }
  pVVar9 = p->vCos;
  uVar5 = pVVar9->nSize;
  uVar14 = (ulong)uVar5;
  if (0 < (int)uVar5) {
    lVar15 = 0;
    do {
      uVar5 = (uint)uVar14;
      uVar8 = pVVar9->pArray[lVar15];
      lVar12 = (long)(int)uVar8;
      if ((lVar12 < 0) || (p->nObjs <= (int)uVar8)) goto LAB_00663d27;
      if (uVar8 == 0) break;
      pGVar2 = p->pObjs;
      uVar13 = (uint)*(undefined8 *)(pGVar2 + lVar12);
      uVar5 = uVar8 - (uVar13 & 0x1fffffff);
      if (((int)uVar5 < 0) || ((int)uVar1 <= (int)uVar5)) goto LAB_00663d65;
      if (uVar1 <= uVar8) goto LAB_00663d46;
      pDVar6 = (DdNode *)((ulong)(uVar13 >> 0x1d & 1) ^ (ulong)__s[uVar5]);
      __s[lVar12] = pDVar6;
      Cudd_Ref(pDVar6);
      Gia_ObjCollapseDeref(p,dd,vFuncs,uVar8 - (*(uint *)(pGVar2 + lVar12) & 0x1fffffff));
      lVar15 = lVar15 + 1;
      pVVar9 = p->vCos;
      uVar5 = pVVar9->nSize;
      uVar14 = (ulong)(int)uVar5;
    } while (lVar15 < (long)uVar14);
  }
  if ((int)uVar1 < 1) {
    iVar11 = 0;
  }
  else {
    uVar14 = 0;
    iVar11 = 0;
    do {
      iVar11 = iVar11 + (uint)(__s[uVar14] == (void *)0x0);
      uVar14 = uVar14 + 1;
    } while (uVar16 != uVar14);
  }
  if (uVar1 != iVar11 + uVar5) {
    __assert_fail("Vec_PtrSize(vFuncs) == Vec_PtrCountZero(vFuncs) + Gia_ManCoNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaClp.c"
                  ,0x14c,"Vec_Ptr_t *Gia_ManCollapse(Gia_Man_t *, DdManager *, int, int)");
  }
  iVar11 = pVVar9->nSize;
  if (0 < (long)iVar11) {
    uVar14 = 0;
    do {
      iVar4 = pVVar9->pArray[uVar14];
      if (((long)iVar4 < 0) || (p->nObjs <= iVar4)) {
LAB_00663d27:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                      ,0x1a3,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (iVar4 == 0) break;
      if ((int)uVar1 <= iVar4) {
LAB_00663d65:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      if (uVar16 == uVar14) goto LAB_00663d46;
      __s[uVar14] = __s[iVar4];
      uVar14 = uVar14 + 1;
    } while ((long)iVar11 != uVar14);
  }
  if (iVar11 <= (int)uVar1) {
    vFuncs->nSize = iVar11;
    return vFuncs;
  }
  __assert_fail("p->nSize >= nSizeNew",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                ,0x232,"void Vec_PtrShrink(Vec_Ptr_t *, int)");
}

Assistant:

Vec_Ptr_t * Gia_ManCollapse( Gia_Man_t * p, DdManager * dd, int nBddLimit, int fVerbose )
{
    Vec_Ptr_t * vFuncs;
    DdNode * bFunc0, * bFunc1, * bFunc;
    Gia_Obj_t * pObj;
    int i, Id;
    Gia_ManCreateRefs( p );
    // assign constant node
    vFuncs = Vec_PtrStart( Gia_ManObjNum(p) );
    if ( Gia_ObjRefNumId(p, 0) > 0 )
        Vec_PtrWriteEntry( vFuncs, 0, Cudd_ReadLogicZero(dd) ), Cudd_Ref(Cudd_ReadLogicZero(dd));
    // assign elementary variables
    Gia_ManForEachCiId( p, Id, i )
        if ( Gia_ObjRefNumId(p, Id) > 0 )
            Vec_PtrWriteEntry( vFuncs, Id, Cudd_bddIthVar(dd,i) ), Cudd_Ref(Cudd_bddIthVar(dd,i));
    // create BDD for AND nodes
    Gia_ManForEachAnd( p, pObj, i )
    {
        bFunc0 = Cudd_NotCond( (DdNode *)Vec_PtrEntry(vFuncs, Gia_ObjFaninId0(pObj, i)), Gia_ObjFaninC0(pObj) );
        bFunc1 = Cudd_NotCond( (DdNode *)Vec_PtrEntry(vFuncs, Gia_ObjFaninId1(pObj, i)), Gia_ObjFaninC1(pObj) );
        bFunc  = Cudd_bddAndLimit( dd, bFunc0, bFunc1, nBddLimit );  
        if ( bFunc == NULL )
        {
            Gia_ManCollapseDeref( dd, vFuncs );
            return NULL;
        }        
        Cudd_Ref( bFunc );
        Vec_PtrWriteEntry( vFuncs, i, bFunc );
        Gia_ObjCollapseDeref( p, dd, vFuncs, Gia_ObjFaninId0(pObj, i) );
        Gia_ObjCollapseDeref( p, dd, vFuncs, Gia_ObjFaninId1(pObj, i) );
    }
    // create BDD for outputs
    Gia_ManForEachCoId( p, Id, i )
    {
        pObj = Gia_ManCo( p, i );
        bFunc0 = Cudd_NotCond( (DdNode *)Vec_PtrEntry(vFuncs, Gia_ObjFaninId0(pObj, Id)), Gia_ObjFaninC0(pObj) );
        Vec_PtrWriteEntry( vFuncs, Id, bFunc0 ); Cudd_Ref( bFunc0 );
        Gia_ObjCollapseDeref( p, dd, vFuncs, Gia_ObjFaninId0(pObj, Id) );
    }
    assert( Vec_PtrSize(vFuncs) == Vec_PtrCountZero(vFuncs) + Gia_ManCoNum(p) );
    // compact
    Gia_ManForEachCoId( p, Id, i )
        Vec_PtrWriteEntry( vFuncs, i, Vec_PtrEntry(vFuncs, Id) );
    Vec_PtrShrink( vFuncs, Gia_ManCoNum(p) );
    return vFuncs;
}